

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setValue(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *x)

{
  bool bVar1;
  type_conflict5 tVar2;
  cpp_dec_float<100U,_int,_void> *in_RDX;
  int in_ESI;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int n;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  IdxSet *in_stack_fffffffffffffe70;
  undefined1 local_fc [160];
  int local_5c;
  int local_4c;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_20;
  reference local_10;
  undefined1 *local_8;
  
  local_4c = in_ESI;
  bVar1 = isSetup(in_RDI);
  if (bVar1) {
    local_5c = pos((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_RDX,in_stack_fffffffffffffe4c);
    if (local_5c < 0) {
      local_20 = local_fc;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      getEpsilon((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5ea45c);
      if (tVar2) {
        IdxSet::add(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                    (int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      }
    }
    else {
      local_30 = &stack0xfffffffffffffe64;
      local_38 = &stack0xfffffffffffffe60;
      local_40 = 0;
      local_8 = local_38;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<100U,_int,_void> *)((ulong)in_stack_fffffffffffffe64 << 0x20),
                 (longlong)in_RDI,in_RDX);
      bVar1 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5ea4e7);
      if (bVar1) {
        clearNum(in_RDI,(int)((ulong)in_RDX >> 0x20));
      }
    }
  }
  local_10 = std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[](&(in_RDI->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).val,(long)local_4c);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }